

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O2

array<cv::Mat,_5UL> * filter_image(array<cv::Mat,_5UL> *__return_storage_ptr__,Mat *pretreat)

{
  long lVar1;
  array<cv::Mat,_5UL> *this;
  array<std::future<cv::Mat>,_5UL> async_result;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Mat local_88 [96];
  
  std::array<cv::Mat,_5UL>::array(__return_storage_ptr__);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_d8,(Mat *)filter_yellow);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)(local_d8 + 0x10),(Mat *)filter_red);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_b8,(Mat *)filter_blue);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_a8,(Mat *)filter_black);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_98,(Mat *)filter_white);
  this = __return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 0x50; lVar1 = lVar1 + 0x10) {
    std::future<cv::Mat>::get((future<cv::Mat> *)local_88);
    cv::Mat::operator=((Mat *)this,local_88);
    cv::Mat::~Mat(local_88);
    this = (array<cv::Mat,_5UL> *)&this->field_0x60;
  }
  std::array<std::future<cv::Mat>,_5UL>::~array((array<std::future<cv::Mat>,_5UL> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::Mat, 5> filter_image(const cv::Mat& pretreat)
{
    std::array<cv::Mat, 5> result;
    std::array<std::future<cv::Mat>, 5> async_result {std::async(filter_yellow, pretreat),
        std::async(filter_red, pretreat), std::async(filter_blue, pretreat), std::async(filter_black, pretreat),
        std::async(filter_white, pretreat)};

    for(std::size_t i = 0; i < result.size(); i++)
    {
        result[i] = async_result[i].get();
    }
    return result;
}